

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRTreeBuildVisitor.cpp
# Opt level: O0

void __thiscall
IRTreeBuildVisitor::IRTreeBuildVisitor(IRTreeBuildVisitor *this,NewScopeLayerTree *tree)

{
  NewScopeLayerTree *tree_local;
  IRTreeBuildVisitor *this_local;
  
  TemplateVisitor<IRT::SubtreeWrapper_*>::TemplateVisitor
            (&this->super_TemplateVisitor<IRT::SubtreeWrapper_*>);
  (this->super_TemplateVisitor<IRT::SubtreeWrapper_*>).super_Visitor._vptr_Visitor =
       (_func_int **)&PTR_Visit_001d92d0;
  std::__cxx11::string::string((string *)&this->current_classname_);
  this->tree_ = tree;
  std::stack<int,std::deque<int,std::allocator<int>>>::
  stack<std::deque<int,std::allocator<int>>,void>
            ((stack<int,std::deque<int,std::allocator<int>>> *)&this->offsets_);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IRT::FrameTranslator_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IRT::FrameTranslator_*>_>_>
  ::unordered_map(&this->frame_translator_);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<IRT::Statement_*,_IRT::FrameTranslator_*>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<IRT::Statement_*,_IRT::FrameTranslator_*>_>_>_>
  ::unordered_map(&this->method_trees_);
  NewScopeLayer::PrepareTraversing(this->tree_->root_);
  this->current_layer_ = this->tree_->root_;
  this->current_frame_ = (FrameTranslator *)0x0;
  return;
}

Assistant:

IRTreeBuildVisitor::IRTreeBuildVisitor(NewScopeLayerTree* tree) : tree_(tree) {
  tree_->root_->PrepareTraversing();
  current_layer_ = tree_->root_;
  current_frame_ = nullptr;
}